

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::anon_unknown_6::ScanLineProcess::update_pointers
          (ScanLineProcess *this,FrameBuffer *outfb,int fbY,int fbLastY)

{
  int iVar1;
  PixelType PVar2;
  exr_coding_channel_info_t *peVar3;
  long lVar4;
  Slice *pSVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  
  iVar1 = (this->cinfo).start_y;
  (this->decoder).user_line_begin_skip = fbY - iVar1;
  (this->decoder).user_line_end_ignore = 0;
  lVar4 = (long)iVar1 + (long)(this->cinfo).height + -1;
  if (fbLastY < lVar4) {
    (this->decoder).user_line_end_ignore = (int)lVar4 - fbLastY;
  }
  if (0 < (this->decoder).channel_count) {
    lVar4 = 0x28;
    lVar9 = 0;
    do {
      peVar3 = (this->decoder).channels;
      pSVar5 = FrameBuffer::findSlice(outfb,*(char **)((long)peVar3 + lVar4 + -0x28));
      if (pSVar5 == (Slice *)0x0) {
        sVar7 = 0;
        sVar8 = 0;
        pcVar6 = (char *)0x0;
      }
      else {
        sVar7 = 0;
        sVar8 = 0;
        pcVar6 = (char *)0x0;
        if (*(int *)((long)peVar3 + lVar4 + -0x20) != 0) {
          PVar2 = pSVar5->type;
          *(ushort *)((long)peVar3 + lVar4 + -0xc) = (ushort)(PVar2 != HALF) * 2 + 2;
          *(short *)((long)peVar3 + lVar4 + -10) = (short)PVar2;
          sVar7 = pSVar5->xStride;
          sVar8 = pSVar5->yStride;
          pcVar6 = pSVar5->base +
                   (long)(fbY / pSVar5->ySampling) * sVar8 +
                   (long)((this->cinfo).start_x / pSVar5->xSampling) * sVar7;
        }
      }
      *(int *)((long)peVar3 + lVar4 + -8) = (int)sVar7;
      *(int *)((long)peVar3 + lVar4 + -4) = (int)sVar8;
      *(char **)((long)&peVar3->channel_name + lVar4) = pcVar6;
      lVar9 = lVar9 + 1;
      lVar4 = lVar4 + 0x30;
    } while (lVar9 < (this->decoder).channel_count);
  }
  return;
}

Assistant:

void ScanLineProcess::update_pointers (
    const FrameBuffer *outfb, int fbY, int fbLastY)
{
    decoder.user_line_begin_skip = fbY - cinfo.start_y;
    decoder.user_line_end_ignore = 0;
    int64_t endY = (int64_t)cinfo.start_y + (int64_t)cinfo.height - 1;
    if ((int64_t)fbLastY < endY)
        decoder.user_line_end_ignore = (int32_t)(endY - fbLastY);

    for (int c = 0; c < decoder.channel_count; ++c)
    {
        exr_coding_channel_info_t& curchan = decoder.channels[c];
        uint8_t*                   ptr;
        const Slice*               fbslice;

        fbslice = outfb->findSlice (curchan.channel_name);

        if (curchan.height == 0 || !fbslice)
        {
            curchan.decode_to_ptr     = NULL;
            curchan.user_pixel_stride = 0;
            curchan.user_line_stride  = 0;
            continue;
        }

        curchan.user_bytes_per_element = (fbslice->type == HALF) ? 2 : 4;
        curchan.user_data_type         = (exr_pixel_type_t)fbslice->type;
        curchan.user_pixel_stride      = fbslice->xStride;
        curchan.user_line_stride       = fbslice->yStride;

        ptr  = reinterpret_cast<uint8_t*> (fbslice->base);
        ptr += int64_t (cinfo.start_x / fbslice->xSampling) * int64_t (fbslice->xStride);
        ptr += int64_t (fbY / fbslice->ySampling) * int64_t (fbslice->yStride);

        curchan.decode_to_ptr = ptr;
    }
}